

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonwriter.cpp
# Opt level: O2

void arrayContentToJson(QCborContainerPrivate *a,QByteArray *json,int indent,bool compact)

{
  char *s;
  long lVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_68;
  QCborValue local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((a != (QCborContainerPrivate *)0x0) && ((a->elements).d.size != 0)) {
    local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.ptr = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray::QByteArray((QByteArray *)&local_68,(long)(indent * 4),' ');
    s = ",\n";
    if (compact) {
      s = ",";
    }
    lVar1 = 1;
    while( true ) {
      QByteArray::append(json,(QByteArray *)&local_68);
      QCborContainerPrivate::valueAt(&local_50,a,lVar1 + -1);
      valueContentToJson(&local_50,json,indent,compact);
      QCborValue::~QCborValue(&local_50);
      if (lVar1 == (a->elements).d.size) break;
      QByteArray::append(json,s);
      lVar1 = lVar1 + 1;
    }
    if (!compact) {
      QByteArray::append(json,'\n');
    }
    QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void arrayContentToJson(const QCborContainerPrivate *a, QByteArray &json, int indent, bool compact)
{
    if (!a || a->elements.empty())
        return;

    QByteArray indentString(4*indent, ' ');

    qsizetype i = 0;
    while (true) {
        json += indentString;
        valueContentToJson(a->valueAt(i), json, indent, compact);

        if (++i == a->elements.size()) {
            if (!compact)
                json += '\n';
            break;
        }

        json += compact ? "," : ",\n";
    }
}